

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Gla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  Abc_Frame_t *pAbc_00;
  long lVar12;
  Vec_Int_t *vStatuses;
  Abs_Par_t Pars;
  Vec_Ptr_t *vSeqModelVec;
  char *local_d8;
  Vec_Int_t *local_d0;
  Abs_Par_t local_c8;
  Abc_Frame_t *local_40;
  Vec_Ptr_t *local_38;
  
  local_40 = pAbc;
  Abs_ParSetDefaults(&local_c8);
  local_d8 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar1 = true;
LAB_00290cbd:
  iVar2 = Extra_UtilGetopt(argc,argv,"FSCMDETRQPBALtfardmnscbpquwvh");
  pAbc_00 = local_40;
  iVar4 = globalUtilOptind;
  switch(iVar2) {
  case 0x41:
    if (globalUtilOptind < argc) {
      local_c8.pFileVabs = argv[globalUtilOptind];
LAB_00290e71:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00290cbd;
    }
    pcVar11 = "Command line switch \"-A\" should be followed by a file name.\n";
    break;
  case 0x42:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nFramesNoChangeLim = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-B\" should be followed by an integer.\n";
    break;
  case 0x43:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nConfLimit = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nLearnedDelta = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nLearnedPerce = uVar3;
      goto LAB_00290f03;
    }
LAB_00290f55:
    pcVar11 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nFramesMax = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6f:
    goto switchD_00290cdd_caseD_47;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_d8 = argv[globalUtilOptind];
      goto LAB_00290e71;
    }
    pcVar11 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nLearnedStart = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (argc <= globalUtilOptind) goto LAB_00290f55;
    uVar3 = atoi(argv[globalUtilOptind]);
    local_c8.nRatioMax = uVar3;
LAB_00290f03:
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
switchD_00290cdd_caseD_47:
      Abc_Print(-2,"usage: &gla [-FSCMDETRQPB num] [-AL file] [-fardmnscbpquwvh]\n");
      Abc_Print(-2,"\t          fixed-time-frame gate-level proof- and cex-based abstraction\n");
      Abc_Print(-2,"\t-F num  : the max number of timeframes to unroll [default = %d]\n",
                (ulong)(uint)local_c8.nFramesMax);
      Abc_Print(-2,"\t-S num  : the starting time frame (0=unused) [default = %d]\n",
                (ulong)(uint)local_c8.nFramesStart);
      Abc_Print(-2,"\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n",
                (ulong)(uint)local_c8.nConfLimit);
      Abc_Print(-2,
                "\t-M num  : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)local_c8.nLearnedStart);
      Abc_Print(-2,"\t-D num  : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)local_c8.nLearnedDelta);
      Abc_Print(-2,"\t-E num  : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)(uint)local_c8.nLearnedPerce);
      Abc_Print(-2,"\t-T num  : an approximate timeout, in seconds [default = %d]\n",
                (ulong)(uint)local_c8.nTimeOut);
      Abc_Print(-2,
                "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_c8.nRatioMin);
      Abc_Print(-2,
                "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_c8.nRatioMin2);
      Abc_Print(-2,
                "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_c8.nRatioMax);
      Abc_Print(-2,
                "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n"
                ,(ulong)(uint)local_c8.nFramesNoChangeLim);
      Abc_Print(-2,
                "\t-A file : file name for dumping abstrated model (&gla -d) or abstraction map (&gla -m)\n"
               );
      pcVar11 = "no logging";
      if (local_d8 != (char *)0x0) {
        pcVar11 = local_d8;
      }
      Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar11);
      pcVar10 = "yes";
      pcVar11 = "yes";
      if (local_c8.fPropFanout == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-f      : toggle propagating fanout implications [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_c8.fAddLayer == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-a      : toggle refinement by adding one layers of gates [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (local_c8.fNewRefine == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-r      : toggle using improved refinement heuristics [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (local_c8.fDumpVabs == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-d      : toggle dumping abstracted model into a file [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (local_c8.fDumpMabs == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-m      : toggle dumping abstraction map into a file [default = %s]\n",pcVar11
               );
      pcVar11 = "yes";
      if (!bVar1) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-n      : toggle using new algorithms [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_c8.fUseSkip == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-s      : toggle skipping previously proved timeframes [default = %s]\n",
                pcVar11);
      pcVar11 = "yes";
      if (local_c8.fUseSimple == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (local_c8.fSkipHash == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-b      : toggle CNF construction without hashing [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_c8.fUseFullProof == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_c8.fCallProver == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-q      : toggle calling the prover [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_c8.fSimpProver == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n"
                ,pcVar11);
      pcVar11 = "yes";
      if (local_c8.fVerbose == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar11);
      if (local_c8.fVeryVerbose == 0) {
        pcVar10 = "no";
      }
      Abc_Print(-2,"\t-w      : toggle printing more verbose information [default = %s]\n",pcVar10);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
    goto LAB_00290cbd;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nRatioMin2 = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nRatioMin = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nFramesStart = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c8.nTimeOut = uVar3;
      goto LAB_00290f03;
    }
    pcVar11 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x61:
    local_c8.fAddLayer = local_c8.fAddLayer ^ 1;
    goto LAB_00290cbd;
  case 0x62:
    local_c8.fSkipHash = local_c8.fSkipHash ^ 1;
    goto LAB_00290cbd;
  case 99:
    local_c8.fUseSimple = local_c8.fUseSimple ^ 1;
    goto LAB_00290cbd;
  case 100:
    local_c8.fDumpVabs = local_c8.fDumpVabs ^ 1;
    goto LAB_00290cbd;
  case 0x66:
    local_c8.fPropFanout = local_c8.fPropFanout ^ 1;
    goto LAB_00290cbd;
  case 0x6d:
    local_c8.fDumpMabs = local_c8.fDumpMabs ^ 1;
    goto LAB_00290cbd;
  case 0x6e:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00290cbd;
  case 0x70:
    local_c8.fUseFullProof = local_c8.fUseFullProof ^ 1;
    goto LAB_00290cbd;
  case 0x71:
    local_c8.fCallProver = local_c8.fCallProver ^ 1;
    goto LAB_00290cbd;
  case 0x72:
    local_c8.fNewRefine = local_c8.fNewRefine ^ 1;
    goto LAB_00290cbd;
  case 0x73:
    local_c8.fUseSkip = local_c8.fUseSkip ^ 1;
    goto LAB_00290cbd;
  case 0x74:
    local_c8.fUseTermVars._0_1_ = (byte)local_c8.fUseTermVars ^ 1;
    goto LAB_00290cbd;
  case 0x75:
    local_c8.fSimpProver = local_c8.fSimpProver ^ 1;
    goto LAB_00290cbd;
  case 0x76:
    local_c8.fVerbose = local_c8.fVerbose ^ 1;
    goto LAB_00290cbd;
  case 0x77:
    local_c8.fVeryVerbose = local_c8.fVeryVerbose ^ 1;
    goto LAB_00290cbd;
  default:
    if (iVar2 == -1) {
      pGVar6 = local_40->pGia;
      if (pGVar6 == (Gia_Man_t *)0x0) {
        pcVar11 = "There is no AIG.\n";
        iVar4 = -1;
      }
      else {
        if (local_c8.nFramesMax < 0) {
          pcVar11 = "The number of starting frames should be a positive integer.\n";
        }
        else {
          if ((local_c8.nFramesMax == 0) || (local_c8.nFramesStart <= local_c8.nFramesMax)) {
            iVar4 = pGVar6->vCos->nSize - pGVar6->nRegs;
            if (iVar4 == 1) {
              if (bVar1) {
                iVar4 = Gia_ManPerformGla(pGVar6,&local_c8);
              }
              else {
                iVar4 = Gia_ManPerformGlaOld(pGVar6,&local_c8,0);
              }
              pAbc_00->Status = iVar4;
              pAbc_00->nFrames = local_c8.iFrame;
              Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
              if (local_d8 == (char *)0x0) {
                return 0;
              }
              Abc_NtkWriteLogFile(local_d8,pAbc_00->pCex,pAbc_00->Status,pAbc_00->nFrames,"&gla");
              return 0;
            }
            local_38 = Vec_PtrStart(iVar4);
            local_d0 = Vec_IntAlloc(pAbc_00->pGia->vCos->nSize - pAbc_00->pGia->nRegs);
            pGVar6 = pAbc_00->pGia;
            pVVar8 = pGVar6->vCos;
            uVar3 = pVVar8->nSize;
            uVar9 = (ulong)uVar3;
            uVar5 = uVar3 - pGVar6->nRegs;
            uVar7 = (ulong)uVar5;
            if (uVar5 == 0 || (int)uVar3 < pGVar6->nRegs) goto LAB_00291508;
            lVar12 = 0;
            goto LAB_00291417;
          }
          pcVar11 = "The starting frame is larger than the max number of frames.\n";
        }
        iVar4 = 1;
      }
      Abc_Print(iVar4,pcVar11);
      return 0;
    }
    goto switchD_00290cdd_caseD_47;
  }
  Abc_Print(-1,pcVar11);
  goto switchD_00290cdd_caseD_47;
  while( true ) {
    pGVar6 = Gia_ManDupDfsOnePo(pGVar6,(int)lVar12);
    if (bVar1) {
      iVar4 = Gia_ManPerformGla(pGVar6,&local_c8);
    }
    else {
      iVar4 = Gia_ManPerformGlaOld(pGVar6,&local_c8,0);
    }
    Vec_IntPush(local_d0,iVar4);
    if (local_d8 != (char *)0x0) {
      Abc_NtkWriteLogFile(local_d8,pGVar6->pCexSeq,iVar4,local_c8.iFrame,"&gla");
    }
    pAbc_00 = local_40;
    if (pGVar6->pCexSeq != (Abc_Cex_t *)0x0) {
      if (local_38->nSize <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      local_38->pArray[lVar12] = pGVar6->pCexSeq;
    }
    pGVar6->pCexSeq = (Abc_Cex_t *)0x0;
    Gia_ManStop(pGVar6);
    lVar12 = lVar12 + 1;
    pGVar6 = pAbc_00->pGia;
    pVVar8 = pGVar6->vCos;
    uVar9 = (ulong)pVVar8->nSize;
    uVar7 = uVar9 - (long)pGVar6->nRegs;
    if ((long)uVar7 <= lVar12) break;
LAB_00291417:
    if ((int)uVar9 <= lVar12) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((pVVar8->pArray[lVar12] < 0) || (pGVar6->nObjs <= pVVar8->pArray[lVar12])) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
  }
LAB_00291508:
  if (local_d0->nSize == (int)uVar7) {
    Abc_FrameReplaceCexVec(pAbc_00,&local_38);
    Abc_FrameReplacePoStatuses(pAbc_00,&local_d0);
    pAbc_00->nFrames = -1;
    return 0;
  }
  __assert_fail("Vec_IntSize(vStatuses) == Gia_ManPoNum(pAbc->pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                ,0xb826,"int Abc_CommandAbc9Gla(Abc_Frame_t *, int, char **)");
}

Assistant:

int Abc_CommandAbc9Gla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abs_Par_t Pars, * pPars = &Pars;
    int c, fNewAlgo = 1;
    char * pLogFileName = NULL;
    Abs_ParSetDefaults( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FSCMDETRQPBALtfardmnscbpquwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesStart < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin2 < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMax < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesNoChangeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesNoChangeLim < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFileVabs = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 't':
            pPars->fUseTermVars ^= 1;
            break;
        case 'f':
            pPars->fPropFanout ^= 1;
            break;
        case 'a':
            pPars->fAddLayer ^= 1;
            break;
        case 'r':
            pPars->fNewRefine ^= 1;
            break;
        case 'd':
            pPars->fDumpVabs ^= 1;
            break;
        case 'm':
            pPars->fDumpMabs ^= 1;
            break;
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 's':
            pPars->fUseSkip ^= 1;
            break;
        case 'c':
            pPars->fUseSimple ^= 1;
            break;
        case 'b':
            pPars->fSkipHash ^= 1;
            break;
        case 'p':
            pPars->fUseFullProof ^= 1;
            break;
        case 'q':
            pPars->fCallProver ^= 1;
            break;
        case 'u':
            pPars->fSimpProver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no AIG.\n" );
        return 0;
    }
/*
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
*/
    if ( pPars->nFramesMax < 0 )
    {
        Abc_Print( 1, "The number of starting frames should be a positive integer.\n" );
        return 0;
    }
    if ( pPars->nFramesMax && pPars->nFramesStart > pPars->nFramesMax )
    {
        Abc_Print( 1, "The starting frame is larger than the max number of frames.\n" );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        if ( fNewAlgo )
            pAbc->Status = Gia_ManPerformGla( pAbc->pGia, pPars );
        else
            pAbc->Status  = Gia_ManPerformGlaOld( pAbc->pGia, pPars, 0 );
        pAbc->nFrames = pPars->iFrame;
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
        if ( pLogFileName )
            Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&gla" );
    }
    else // iterate over outputs
    {
        Gia_Obj_t * pObj; int o, Status;
        Vec_Ptr_t * vSeqModelVec = Vec_PtrStart( Gia_ManPoNum(pAbc->pGia) );
        Vec_Int_t * vStatuses = Vec_IntAlloc( Gia_ManPoNum(pAbc->pGia) );
        Gia_ManForEachPo( pAbc->pGia, pObj, o )
        {
            Gia_Man_t * pOne = Gia_ManDupDfsOnePo( pAbc->pGia, o );
            if ( fNewAlgo )
                Status = Gia_ManPerformGla( pOne, pPars );
            else
                Status = Gia_ManPerformGlaOld( pOne, pPars, 0 );
            Vec_IntPush( vStatuses, Status );
            if ( pLogFileName )
                Abc_NtkWriteLogFile( pLogFileName, pOne->pCexSeq, Status, pPars->iFrame, "&gla" );
            if ( pOne->pCexSeq )
                Vec_PtrWriteEntry( vSeqModelVec, o, pOne->pCexSeq );
            pOne->pCexSeq = NULL;
            Gia_ManStop( pOne );
        }
        assert( Vec_IntSize(vStatuses) == Gia_ManPoNum(pAbc->pGia) );
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
        Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
        pAbc->nFrames = -1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &gla [-FSCMDETRQPB num] [-AL file] [-fardmnscbpquwvh]\n" );
    Abc_Print( -2, "\t          fixed-time-frame gate-level proof- and cex-based abstraction\n" );
    Abc_Print( -2, "\t-F num  : the max number of timeframes to unroll [default = %d]\n", pPars->nFramesMax );
    Abc_Print( -2, "\t-S num  : the starting time frame (0=unused) [default = %d]\n", pPars->nFramesStart );
    Abc_Print( -2, "\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n", pPars->nConfLimit );
    Abc_Print( -2, "\t-M num  : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-D num  : delta value for learned clause removal [default = %d]\n", pPars->nLearnedDelta );
    Abc_Print( -2, "\t-E num  : ratio percentage for learned clause removal [default = %d]\n", pPars->nLearnedPerce );
    Abc_Print( -2, "\t-T num  : an approximate timeout, in seconds [default = %d]\n", pPars->nTimeOut );
    Abc_Print( -2, "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n", pPars->nRatioMin );
    Abc_Print( -2, "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n", pPars->nRatioMin2 );
    Abc_Print( -2, "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n", pPars->nRatioMax );
    Abc_Print( -2, "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n", pPars->nFramesNoChangeLim );
    Abc_Print( -2, "\t-A file : file name for dumping abstrated model (&gla -d) or abstraction map (&gla -m)\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-f      : toggle propagating fanout implications [default = %s]\n", pPars->fPropFanout? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle refinement by adding one layers of gates [default = %s]\n", pPars->fAddLayer? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle using improved refinement heuristics [default = %s]\n", pPars->fNewRefine? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping abstracted model into a file [default = %s]\n", pPars->fDumpVabs? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle dumping abstraction map into a file [default = %s]\n", pPars->fDumpMabs? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle using new algorithms [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle skipping previously proved timeframes [default = %s]\n", pPars->fUseSkip? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n", pPars->fUseSimple? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggle CNF construction without hashing [default = %s]\n", pPars->fSkipHash? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n", pPars->fUseFullProof? "yes": "no" );
    Abc_Print( -2, "\t-q      : toggle calling the prover [default = %s]\n", pPars->fCallProver? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n", pPars->fSimpProver? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w      : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}